

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O3

QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_> * __thiscall
QAccessibleWidget::relations
          (QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_>
           *__return_storage_ptr__,QAccessibleWidget *this,Relation match)

{
  qsizetype qVar1;
  long lVar2;
  QObject *pQVar3;
  QWidget *pQVar4;
  QWidget *pQVar5;
  QWidget *pQVar6;
  long lVar7;
  ulong uVar8;
  undefined1 *puVar9;
  long in_FS_OFFSET;
  QAccessibleInterface *iface;
  QArrayData *local_90 [3];
  QString local_78;
  QWidgetList local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr =
       (pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_> *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (((uint)match.super_QFlagsStorageHelper<QAccessible::RelationFlag,_4>.
             super_QFlagsStorage<QAccessible::RelationFlag>.i & 1) != 0) {
    local_90[0] = (QArrayData *)CONCAT44(local_90[0]._4_4_,1);
    lVar2 = (**(code **)(*(long *)this + 0x18))(this);
    lVar7 = 0;
    if ((*(byte *)(*(long *)(lVar2 + 8) + 0x30) & 1) != 0) {
      lVar7 = lVar2;
    }
    pQVar4 = *(QWidget **)(*(long *)(lVar7 + 8) + 0x10);
    if (pQVar4 != (QWidget *)0x0) {
      local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
      _q_ac_childWidgets(&local_58,pQVar4);
      if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
        lVar7 = local_58.d.size << 3;
        lVar2 = 0;
        do {
          pQVar3 = (QObject *)QMetaObject::cast((QObject *)&QLabel::staticMetaObject);
          if (pQVar3 != (QObject *)0x0) {
            pQVar4 = QLabel::buddy((QLabel *)pQVar3);
            pQVar5 = (QWidget *)(**(code **)(*(long *)this + 0x18))(this);
            if (pQVar5 == (QWidget *)0x0) {
              pQVar6 = (QWidget *)0x0;
            }
            else {
              pQVar6 = (QWidget *)0x0;
              if ((*(byte *)(*(long *)&pQVar5->field_0x8 + 0x30) & 1) != 0) {
                pQVar6 = pQVar5;
              }
            }
            if (pQVar4 == pQVar6) {
              local_78.d.d = (Data *)QAccessible::queryAccessibleInterface(pQVar3);
              QtPrivate::
              QPodArrayOps<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>>::
              emplace<QAccessibleInterface*&,QFlags<QAccessible::RelationFlag>const&>
                        ((QPodArrayOps<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>>
                          *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
                         (QAccessibleInterface **)&local_78,
                         (QFlags<QAccessible::RelationFlag> *)local_90);
              QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_>::end
                        (__return_storage_ptr__);
            }
          }
          lVar2 = lVar2 + 8;
        } while (lVar7 != lVar2);
      }
      pQVar3 = (QObject *)QMetaObject::cast((QObject *)&QGroupBox::staticMetaObject);
      if (pQVar3 != (QObject *)0x0) {
        QGroupBox::title(&local_78,(QGroupBox *)pQVar3);
        qVar1 = local_78.d.size;
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((undefined1 *)qVar1 != (undefined1 *)0x0) {
          local_78.d.d = (Data *)QAccessible::queryAccessibleInterface(pQVar3);
          QtPrivate::
          QPodArrayOps<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>>::
          emplace<QAccessibleInterface*&,QFlags<QAccessible::RelationFlag>const&>
                    ((QPodArrayOps<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>>
                      *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
                     (QAccessibleInterface **)&local_78,
                     (QFlags<QAccessible::RelationFlag> *)local_90);
          QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_>::end
                    (__return_storage_ptr__);
        }
      }
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
        }
      }
    }
  }
  if (((uint)match.super_QFlagsStorageHelper<QAccessible::RelationFlag,_4>.
             super_QFlagsStorage<QAccessible::RelationFlag>.i & 8) != 0) {
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (QWidget **)0x0;
    local_58.d.size = 0;
    (**(code **)(*(long *)this + 0x18))(this);
    if ((this->d->primarySignals).d.size != 0) {
      uVar8 = 0;
      do {
        local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QString::toLatin1_helper((QString *)local_90);
        QObjectPrivate::receiverList((char *)&local_78);
        if (local_90[0] != (QArrayData *)0x0) {
          LOCK();
          (local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_90[0],1,0x10);
          }
        }
        QtPrivate::QCommonArrayOps<QObject_*>::growAppend
                  ((QCommonArrayOps<QObject_*> *)&local_58,(QObject **)local_78.d.ptr,
                   (QObject **)((long)local_78.d.ptr + local_78.d.size * 8));
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,8,0x10);
          }
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < (ulong)(this->d->primarySignals).d.size);
    }
    local_90[0] = (QArrayData *)(**(code **)(*(long *)this + 0x18))(this);
    local_78.d.d = (Data *)local_90;
    QtPrivate::
    sequential_erase_if<QList<QObject*>,QtPrivate::sequential_erase<QList<QObject*>,QObject*>(QList<QObject*>&,QObject*const&)::_lambda(auto:1_const&)_1_>
              ((QList<QObject_*> *)&local_58,(anon_class_8_1_54a39814_for__M_pred *)&local_78);
    if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
      puVar9 = (undefined1 *)0x0;
      do {
        local_90[0] = (QArrayData *)CONCAT44(local_90[0]._4_4_,8);
        local_78.d.d = (Data *)QAccessible::queryAccessibleInterface
                                         (&local_58.d.ptr[(long)puVar9]->super_QObject);
        if ((QArrayData *)local_78.d.d != (QArrayData *)0x0) {
          QtPrivate::
          QPodArrayOps<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>>::
          emplace<QAccessibleInterface*&,QFlags<QAccessible::RelationFlag>const&>
                    ((QPodArrayOps<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>>
                      *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
                     (QAccessibleInterface **)&local_78,
                     (QFlags<QAccessible::RelationFlag> *)local_90);
          QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_>::end
                    (__return_storage_ptr__);
        }
        puVar9 = puVar9 + 1;
      } while (puVar9 < (ulong)local_58.d.size);
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<std::pair<QAccessibleInterface *, QAccessible::Relation>>
QAccessibleWidget::relations(QAccessible::Relation match /*= QAccessible::AllRelations*/) const
{
    QList<std::pair<QAccessibleInterface *, QAccessible::Relation>> rels;
    if (match & QAccessible::Label) {
        const QAccessible::Relation rel = QAccessible::Label;
        if (QWidget *parent = widget()->parentWidget()) {
#if QT_CONFIG(shortcut) && QT_CONFIG(label)
            // first check for all siblings that are labels to us
            // ideally we would go through all objects and check, but that
            // will be too expensive
            const QList<QWidget*> kids = _q_ac_childWidgets(parent);
            for (QWidget *kid : kids) {
                if (QLabel *labelSibling = qobject_cast<QLabel*>(kid)) {
                    if (labelSibling->buddy() == widget()) {
                        QAccessibleInterface *iface = QAccessible::queryAccessibleInterface(labelSibling);
                        rels.emplace_back(iface, rel);
                    }
                }
            }
#endif
#if QT_CONFIG(groupbox)
            QGroupBox *groupbox = qobject_cast<QGroupBox*>(parent);
            if (groupbox && !groupbox->title().isEmpty()) {
                QAccessibleInterface *iface = QAccessible::queryAccessibleInterface(groupbox);
                rels.emplace_back(iface, rel);
            }
#endif
        }
    }

    if (match & QAccessible::Controlled) {
        QObjectList allReceivers;
        QObject *connectionObject = object();
        for (int sig = 0; sig < d->primarySignals.size(); ++sig) {
            const QObjectList receivers = connectionObject->d_func()->receiverList(d->primarySignals.at(sig).toLatin1());
            allReceivers += receivers;
        }

        allReceivers.removeAll(object());  //### The object might connect to itself internally

        for (int i = 0; i < allReceivers.size(); ++i) {
            const QAccessible::Relation rel = QAccessible::Controlled;
            QAccessibleInterface *iface = QAccessible::queryAccessibleInterface(allReceivers.at(i));
            if (iface)
                rels.emplace_back(iface, rel);
        }
    }

    return rels;
}